

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O1

void __thiscall ot::commissioner::coap::Message::Message(Message *this)

{
  _Rb_tree_header *p_Var1;
  
  *(undefined4 *)&this->mHeader = 1;
  p_Var1 = &(this->mOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mRequestUri)._M_dataplus._M_p = (pointer)&(this->mRequestUri).field_2;
  (this->mRequestUri)._M_string_length = 0;
  (this->mRequestUri).field_2._M_local_buf[0] = '\0';
  this->mSubType = kNone;
  this->mEndpoint = (Endpoint *)0x0;
  return;
}

Assistant:

Header()
            : mVersion(kVersion1)
            , mType(0)
            , mTokenLength(0)
            , mCode(0)
            , mMessageId(0)
        {
        }